

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

bool s2pred::ArePointsAntipodal(Vector3_xf *x,Vector3_xf *y)

{
  bool bVar1;
  int iVar2;
  bool local_45;
  ExactFloat local_30;
  Vector3_xf *local_20;
  Vector3_xf *y_local;
  Vector3_xf *x_local;
  
  local_20 = y;
  y_local = x;
  bVar1 = ArePointsLinearlyDependent(x,y);
  local_45 = false;
  if (bVar1) {
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_30,y_local);
    iVar2 = ExactFloat::sgn(&local_30);
    local_45 = iVar2 < 0;
  }
  x_local._7_1_ = local_45;
  if (bVar1) {
    ExactFloat::~ExactFloat(&local_30);
  }
  return (bool)(x_local._7_1_ & 1);
}

Assistant:

bool ArePointsAntipodal(const Vector3_xf& x, const Vector3_xf& y) {
  return ArePointsLinearlyDependent(x, y) && x.DotProd(y).sgn() < 0;
}